

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entities.c
# Opt level: O0

xmlEntityPtr
xmlAddDocEntity(xmlDocPtr doc,xmlChar *name,int type,xmlChar *ExternalID,xmlChar *SystemID,
               xmlChar *content)

{
  xmlDtdPtr dtd_00;
  xmlDtdPtr dtd;
  xmlEntityPtr ret;
  xmlChar *content_local;
  xmlChar *SystemID_local;
  xmlChar *ExternalID_local;
  int type_local;
  xmlChar *name_local;
  xmlDocPtr doc_local;
  
  if (doc == (xmlDocPtr)0x0) {
    xmlEntitiesErr(XML_DTD_NO_DOC,"xmlAddDocEntity: document is NULL");
    doc_local = (xmlDocPtr)0x0;
  }
  else if (doc->intSubset == (_xmlDtd *)0x0) {
    xmlEntitiesErr(XML_DTD_NO_DTD,"xmlAddDocEntity: document without internal subset");
    doc_local = (xmlDocPtr)0x0;
  }
  else {
    dtd_00 = doc->intSubset;
    doc_local = (xmlDocPtr)xmlAddEntity(dtd_00,name,type,ExternalID,SystemID,content);
    if (doc_local == (xmlDocPtr)0x0) {
      doc_local = (xmlDocPtr)0x0;
    }
    else {
      doc_local->parent = (_xmlNode *)dtd_00;
      doc_local->doc = dtd_00->doc;
      if (dtd_00->last == (_xmlNode *)0x0) {
        dtd_00->last = (_xmlNode *)doc_local;
        dtd_00->children = (_xmlNode *)doc_local;
      }
      else {
        dtd_00->last->next = (_xmlNode *)doc_local;
        doc_local->prev = dtd_00->last;
        dtd_00->last = (_xmlNode *)doc_local;
      }
    }
  }
  return (xmlEntityPtr)doc_local;
}

Assistant:

xmlEntityPtr
xmlAddDocEntity(xmlDocPtr doc, const xmlChar *name, int type,
	        const xmlChar *ExternalID, const xmlChar *SystemID,
	        const xmlChar *content) {
    xmlEntityPtr ret;
    xmlDtdPtr dtd;

    if (doc == NULL) {
	xmlEntitiesErr(XML_DTD_NO_DOC,
	        "xmlAddDocEntity: document is NULL");
	return(NULL);
    }
    if (doc->intSubset == NULL) {
	xmlEntitiesErr(XML_DTD_NO_DTD,
	        "xmlAddDocEntity: document without internal subset");
	return(NULL);
    }
    dtd = doc->intSubset;
    ret = xmlAddEntity(dtd, name, type, ExternalID, SystemID, content);
    if (ret == NULL) return(NULL);

    /*
     * Link it to the DTD
     */
    ret->parent = dtd;
    ret->doc = dtd->doc;
    if (dtd->last == NULL) {
	dtd->children = dtd->last = (xmlNodePtr) ret;
    } else {
	dtd->last->next = (xmlNodePtr) ret;
	ret->prev = dtd->last;
	dtd->last = (xmlNodePtr) ret;
    }
    return(ret);
}